

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AZHighLevelEncoder.cpp
# Opt level: O1

EncodingState *
ZXing::Aztec::ShiftAndAppend
          (EncodingState *__return_storage_ptr__,EncodingState *state,int mode,int value)

{
  uint uVar1;
  vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> tokens;
  Token local_4c;
  vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> local_48;
  
  uVar1 = state->mode == 2 ^ 5;
  std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::vector
            (&local_48,&state->tokens);
  local_4c = (Token)(((int)*(char *)((long)mode + (long)state->mode * 6 + SHIFT_TABLE) & 0xffffU) +
                    uVar1 * -0x10000);
  std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::
  emplace_back<ZXing::Aztec::Token>(&local_48,&local_4c);
  local_4c = (Token)(value & 0xffffU | 0xfffb0000);
  std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::
  emplace_back<ZXing::Aztec::Token>(&local_48,&local_4c);
  std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::vector
            (&__return_storage_ptr__->tokens,&local_48);
  __return_storage_ptr__->mode = state->mode;
  __return_storage_ptr__->binaryShiftByteCount = 0;
  __return_storage_ptr__->bitCount = state->bitCount + uVar1 + 5;
  if (local_48.super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

static EncodingState ShiftAndAppend(const EncodingState& state, int mode, int value)
{
	//assert binaryShiftByteCount == 0 && this.mode != mode;
	int thisModeBitCount = state.mode == MODE_DIGIT ? 4 : 5;
	// Shifts exist only to UPPER and PUNCT, both with tokens size 5.
	auto tokens = state.tokens;
	tokens.push_back(Token::CreateSimple(SHIFT_TABLE[state.mode][mode], thisModeBitCount));
	tokens.push_back(Token::CreateSimple(value, 5));
	return EncodingState{ tokens, state.mode, 0, state.bitCount + thisModeBitCount + 5 };
}